

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error texs_swizzle(context *ctx,token *token,opcode *op)

{
  int iVar1;
  opcode *in_RCX;
  uint64_t bits;
  token local_48;
  
  if ((char)(~in_RCX->value >> 0x1c) == '\0') {
    iVar1 = equal((token *)op,"R");
    if (iVar1 != 0) goto LAB_00126046;
    iVar1 = equal((token *)op,"G");
    if (iVar1 == 0) {
      iVar1 = equal((token *)op,"B");
      if (iVar1 == 0) {
        iVar1 = equal((token *)op,"A");
        if (iVar1 == 0) {
          iVar1 = equal((token *)op,"RG");
          if (iVar1 != 0) goto LAB_00126034;
          iVar1 = equal((token *)op,"RA");
          if (iVar1 == 0) {
            iVar1 = equal((token *)op,"GA");
            if (iVar1 == 0) {
              iVar1 = equal((token *)op,"BA");
              if (iVar1 == 0) goto LAB_001260c5;
              bits = 0x1c000000000000;
            }
            else {
              bits = 0x18000000000000;
            }
          }
          else {
            bits = 0x14000000000000;
          }
        }
        else {
LAB_00126011:
          bits = 0xc000000000000;
        }
      }
      else {
LAB_00125ff2:
        bits = 0x8000000000000;
      }
    }
    else {
LAB_00125fd3:
      bits = 0x4000000000000;
    }
  }
  else {
    iVar1 = equal((token *)op,"RGB");
    if (iVar1 != 0) goto LAB_00126046;
    iVar1 = equal((token *)op,"RGA");
    if (iVar1 != 0) goto LAB_00125fd3;
    iVar1 = equal((token *)op,"RBA");
    if (iVar1 != 0) goto LAB_00125ff2;
    iVar1 = equal((token *)op,"GBA");
    if (iVar1 != 0) goto LAB_00126011;
    iVar1 = equal((token *)op,"RGBA");
    if (iVar1 == 0) {
LAB_001260c5:
      fail((token *)ctx,(char *)op,"invalid RGBA swizzle");
      return (unique_ptr<char[],_std::default_delete<char[]>_>)
             (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
    }
LAB_00126034:
    bits = 0x10000000000000;
  }
  opcode::add_bits(in_RCX,bits);
LAB_00126046:
  context::tokenize(&local_48,(context *)token);
  *(int *)&op[2].value = local_48.column;
  op[1].value = (uint64_t)local_48.data.string._M_str;
  op[1].reuse = local_48.type;
  op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.line;
  op->value = (uint64_t)local_48.filename;
  op->reuse = local_48.data.predicate.index;
  op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.data.predicate.negated;
  ctx->pc = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(texs_swizzle)
{
    if (((op.value >> 28) & 0xFF) == 0xFF) {
        if (equal(token, "R")) {
            op.add_bits(0x0000000000000000ULL);
        } else if (equal(token, "G")) {
            op.add_bits(0x0004000000000000ULL);
        } else if (equal(token, "B")) {
            op.add_bits(0x0008000000000000ULL);
        } else if (equal(token, "A")) {
            op.add_bits(0x000C000000000000ULL);
        } else if (equal(token, "RG")) {
            op.add_bits(0x0010000000000000ULL);
        } else if (equal(token, "RA")) {
            op.add_bits(0x0014000000000000ULL);
        } else if (equal(token, "GA")) {
            op.add_bits(0x0018000000000000ULL);
        } else if (equal(token, "BA")) {
            op.add_bits(0x001C000000000000ULL);
        } else {
            return fail(token, "invalid RGBA swizzle");
        }
    } else {
        if (equal(token, "RGB")) {
            op.add_bits(0x0000000000000000ULL);
        } else if (equal(token, "RGA")) {
            op.add_bits(0x0004000000000000ULL);
        } else if (equal(token, "RBA")) {
            op.add_bits(0x0008000000000000ULL);
        } else if (equal(token, "GBA")) {
            op.add_bits(0x000C000000000000ULL);
        } else if (equal(token, "RGBA")) {
            op.add_bits(0x0010000000000000ULL);
        } else {
            return fail(token, "invalid RGBA swizzle");
        }
    }
    token = ctx.tokenize();
    return {};
}